

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

string * __thiscall
project::get_msvc_config_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *library;
  buildExport b;
  stringstream ss;
  string local_478;
  string local_458;
  string local_438;
  buildExport local_418;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_418.targetFolder._M_dataplus._M_p = (pointer)&local_418.targetFolder.field_2;
  local_418.targetFolder._M_string_length = 0;
  local_418.targetFolder.field_2._M_local_buf[0] = '\0';
  local_418.cppLanguageStandard._M_dataplus._M_p = (pointer)&local_418.cppLanguageStandard.field_2;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.cppLanguageStandard._M_string_length = 0;
  local_418.cppLanguageStandard.field_2._M_local_buf[0] = '\0';
  local_418.extraCompilerFlags._M_dataplus._M_p = (pointer)&local_418.extraCompilerFlags.field_2;
  local_418.extraCompilerFlags._M_string_length = 0;
  local_418.extraCompilerFlags.field_2._M_local_buf[0] = '\0';
  local_418.extraLinkerFlags._M_dataplus._M_p = (pointer)&local_418.extraLinkerFlags.field_2;
  local_418.extraLinkerFlags._M_string_length = 0;
  local_418.extraLinkerFlags.field_2._M_local_buf[0] = '\0';
  local_418.extraFrameworks._M_dataplus._M_p = (pointer)&local_418.extraFrameworks.field_2;
  local_418.extraFrameworks._M_string_length = 0;
  local_418.extraFrameworks.field_2._M_local_buf[0] = '\0';
  local_418.smallIcon._M_dataplus._M_p = (pointer)&local_418.smallIcon.field_2;
  local_418.smallIcon._M_string_length = 0;
  local_418.smallIcon.field_2._M_local_buf[0] = '\0';
  local_418.bigIcon._M_dataplus._M_p = (pointer)&local_418.bigIcon.field_2;
  local_418.bigIcon._M_string_length = 0;
  local_418.bigIcon.field_2._M_local_buf[0] = '\0';
  local_418.vstLegacyFolder._M_dataplus._M_p = (pointer)&local_418.vstLegacyFolder.field_2;
  local_418.vstLegacyFolder._M_string_length = 0;
  local_418.vstLegacyFolder.field_2._M_local_buf[0] = '\0';
  local_418.vst3Folder._M_dataplus._M_p = (pointer)&local_418.vst3Folder.field_2;
  local_418.vst3Folder._M_string_length = 0;
  local_418.vst3Folder.field_2._M_local_buf[0] = '\0';
  local_418.debug.name._M_dataplus._M_p = (pointer)&local_418.debug.name.field_2;
  local_418.debug.name._M_string_length = 0;
  local_418.debug.name.field_2._M_local_buf[0] = '\0';
  local_418.debug.targetName._M_dataplus._M_p = (pointer)&local_418.debug.targetName.field_2;
  local_418.debug.targetName._M_string_length = 0;
  local_418.debug.targetName.field_2._M_local_buf[0] = '\0';
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.name._M_dataplus._M_p = (pointer)&local_418.release.name.field_2;
  local_418.release.name._M_string_length = 0;
  local_418.release.name.field_2._M_local_buf[0] = '\0';
  local_418.release.targetName._M_dataplus._M_p = (pointer)&local_418.release.targetName.field_2;
  local_418.release.targetName._M_string_length = 0;
  local_418.release.targetName.field_2._M_local_buf[0] = '\0';
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"VS2019","");
  get_export(this,&local_438,&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p);
  }
  if (local_418.valid == false) {
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"VS2017","");
    get_export(this,&local_458,&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    if (local_418.valid == false) {
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"VS2015","");
      get_export(this,&local_478,&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
      if (local_418.valid == false) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_0010e1c8;
      }
      pcVar5 = "Using VS2015 Config";
    }
    else {
      pcVar5 = "Using VS2017 Config";
    }
  }
  else {
    pcVar5 = "Using VS2019 Config";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  if (local_418.debug.headerPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_418.debug.headerPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"    target_include_directories(",0x1f);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," PUBLIC\n",8);
    pbVar1 = local_418.debug.headerPath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = local_418.debug.headerPath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        \"${CMAKE_SYSROOT}/",0x1a);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    )\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if ((local_418.extraCompilerFlags._M_string_length != 0) ||
     (local_418.extraDefs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_418.extraDefs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    target_compile_options(",0x1b)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," PUBLIC \n",9);
    pbVar4 = local_418.extraDefs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = local_418.extraDefs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_418.extraCompilerFlags._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_418.extraCompilerFlags._M_dataplus._M_p,
                          local_418.extraCompilerFlags._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pbVar4 = local_418.extraDefs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = local_418.extraDefs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pbVar2 = local_418.extraDefs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        pbVar4 != local_418.extraDefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      local_418.extraDefs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pbVar1 = local_418.extraDefs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_418.extraDefs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
    }
    local_418.extraDefs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    )\n",6);
  }
  if (local_418.debug.libraryPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_418.debug.libraryPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"    target_link_directories(",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," BEFORE PUBLIC\n",0xf);
    pbVar1 = local_418.debug.libraryPath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = local_418.debug.libraryPath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"        \"${CMAKE_SYSROOT}/",0x1a);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    )\n",6);
  }
  if ((local_418.externalLibraries.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_418.externalLibraries.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_418.extraLinkerFlags._M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    target_link_libraries(",0x1a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    pbVar1 = local_418.externalLibraries.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = local_418.externalLibraries.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"        ",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_418.extraLinkerFlags._M_dataplus._M_p,
                        local_418.extraLinkerFlags._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    )\n",6);
  }
  std::__cxx11::stringbuf::str();
LAB_0010e1c8:
  buildExport::~buildExport(&local_418);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string project::get_msvc_config()
{
    std::stringstream ss;

    project::buildExport b;

    get_export("VS2019", b);
    if(!b.valid)
    {
        get_export("VS2017", b);
        if(!b.valid)
        {
            get_export("VS2015", b);
            if(b.valid)
            {
                std::cout << "Using VS2015 Config" << std::endl;
            }
            else
            {
                return "";
            }
            
        }
        else
        {
            std::cout << "Using VS2017 Config" << std::endl;
        }
    }
    else
    {
        std::cout << "Using VS2019 Config" << std::endl;
    }
    
    if(!b.debug.headerPath.empty())
    {
        ss << "\n";
        ss << "    target_include_directories(" << name << " PUBLIC\n";
        for(auto const& path : b.debug.headerPath)
        {
            ss << "        \"${CMAKE_SYSROOT}/" << path << "\"\n";
        }
        ss << "    )\n";
        ss << "\n";
    }
    if(!b.extraCompilerFlags.empty() || !b.extraDefs.empty())
    {
        ss << "\n";
        ss << "    target_compile_options(" << name << " PUBLIC \n";
        if(!b.extraCompilerFlags.empty())
        {
            ss << "        " << b.extraCompilerFlags << "\n";
        }
        for(auto const& def : b.extraDefs)
        {
            ss << "        " << def << "\n";
        }
        ss << "    )\n";
    }
    if(!b.debug.libraryPath.empty())
    {
        ss << "\n";
        ss << "    target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "        \"${CMAKE_SYSROOT}/" << path << "\"\n";
        }
        ss << "    )\n";
    }
    if(!b.externalLibraries.empty() || !b.extraLinkerFlags.empty())
    {
        ss << "\n";
        ss << "    target_link_libraries(" << name << "\n";
        for(auto const& library : b.externalLibraries)
        {
            ss << "        " << library << "\n";
        }
        ss << "        " << b.extraLinkerFlags << "\n";
        ss << "    )\n";
    }

    return ss.str();
}